

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_01;
  undefined8 *puVar1;
  pointer pBVar2;
  int *piVar3;
  Allocator *pAVar4;
  pointer pMVar5;
  long *plVar6;
  int iVar7;
  int iVar8;
  Layer *pLVar9;
  undefined4 extraout_var;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  void *__ptr;
  Mat *pMVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  int *piVar18;
  int j;
  long lVar19;
  size_t sVar20;
  size_t sStack_430;
  allocator<char> local_41d;
  int top_count;
  int bottom_count;
  int local_414;
  ulong local_410;
  int blob_count;
  Mat *local_400;
  ulong local_3f8;
  Layer *local_3f0;
  ulong local_3e8;
  long local_3e0;
  int layer_count;
  DataReader *local_3d0;
  vector<int,_std::allocator<int>_> *local_3c8;
  int magic;
  string *local_3b8;
  vector<int,_std::allocator<int>_> *local_3b0;
  Net *local_3a8;
  ParamDict pd;
  Mat local_388;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  
  magic = 0;
  iVar7 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar7 == 1) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar7 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar7 == 1) {
        iVar7 = (*dr->_vptr_DataReader[2])(dr,"%d",&blob_count);
        if (iVar7 == 1) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)layer_count);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)blob_count);
            ParamDict::ParamDict(&pd);
            uVar11 = 0;
            local_3e8 = 0;
            local_3d0 = dr;
            local_3a8 = this;
            do {
              if ((long)layer_count <= (long)uVar11) {
                NetPrivate::update_input_output_indexes(this->d);
                iVar7 = 0;
                NetPrivate::update_input_output_names(this->d);
LAB_001636f7:
                ParamDict::~ParamDict(&pd);
                return iVar7;
              }
              bottom_count = 0;
              top_count = 0;
              local_410 = uVar11;
              iVar7 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_type);
              if (iVar7 != 1) {
                pcVar16 = "parse layer_type failed";
LAB_001637d5:
                sStack_430 = 0x17;
LAB_001636e0:
                fwrite(pcVar16,sStack_430,1,_stderr);
                fputc(10,_stderr);
LAB_001636f4:
                iVar7 = -1;
                goto LAB_001636f7;
              }
              iVar7 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_name);
              if (iVar7 != 1) {
                pcVar16 = "parse layer_name failed";
                goto LAB_001637d5;
              }
              iVar7 = (*dr->_vptr_DataReader[2])(dr,"%d",&bottom_count);
              if (iVar7 != 1) {
                pcVar16 = "parse bottom_count failed";
                sStack_430 = 0x19;
                goto LAB_001636e0;
              }
              iVar7 = (*dr->_vptr_DataReader[2])(dr,"%d",&top_count);
              if (iVar7 != 1) {
                pcVar16 = "parse top_count failed";
LAB_001636de:
                sStack_430 = 0x16;
                goto LAB_001636e0;
              }
              pLVar9 = create_layer(layer_type);
              if (pLVar9 == (Layer *)0x0) {
                iVar7 = (*this->_vptr_Net[3])(this,layer_type);
                pLVar9 = (Layer *)CONCAT44(extraout_var,iVar7);
                if (pLVar9 != (Layer *)0x0) goto LAB_00162eb6;
                fprintf(_stderr,"layer %s not exists or registered",layer_type);
                fputc(10,_stderr);
                clear(this);
                goto LAB_001636f4;
              }
LAB_00162eb6:
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)bottom_name,layer_type,(allocator<char> *)&local_388);
              std::__cxx11::string::operator=((string *)&pLVar9->type,(string *)bottom_name);
              std::__cxx11::string::~string((string *)bottom_name);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)bottom_name,layer_name,(allocator<char> *)&local_388);
              local_3b8 = &pLVar9->name;
              std::__cxx11::string::operator=((string *)local_3b8,(string *)bottom_name);
              std::__cxx11::string::~string((string *)bottom_name);
              this_00 = &pLVar9->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(this_00,(long)bottom_count);
              lVar13 = 0;
              local_3f0 = pLVar9;
              while( true ) {
                uVar11 = local_3e8;
                iVar7 = (int)local_3e8;
                lVar19 = (long)(int)local_3e8;
                if (bottom_count <= lVar13) break;
                iVar8 = (*local_3d0->_vptr_DataReader[2])(local_3d0,"%255s",(Mat *)bottom_name);
                if (iVar8 != 1) {
                  pcVar16 = "parse bottom_name failed";
                  sStack_430 = 0x18;
                  goto LAB_001636e0;
                }
                iVar8 = find_blob_index_by_name(this,bottom_name);
                if (iVar8 == -1) {
                  pBVar2 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_388,bottom_name,&local_41d);
                  std::__cxx11::string::operator=((string *)(pBVar2 + lVar19),(string *)&local_388);
                  std::__cxx11::string::~string((string *)&local_388);
                  iVar8 = (int)local_3e8;
                  local_3e8 = (ulong)(iVar7 + 1);
                }
                else {
                  lVar19 = (long)iVar8;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[lVar19].consumer = (int)local_410;
                (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar13] = iVar8;
                lVar13 = lVar13 + 1;
              }
              local_3c8 = &local_3f0->tops;
              std::vector<int,_std::allocator<int>_>::resize(local_3c8,(long)top_count);
              local_3e8 = uVar11 & 0xffffffff;
              lVar19 = lVar19 * 0x70;
              local_3b0 = this_00;
              for (lVar13 = 0; dr = local_3d0, lVar13 < top_count; lVar13 = lVar13 + 1) {
                pBVar2 = (this->d->blobs).
                         super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar7 = (*local_3d0->_vptr_DataReader[2])(local_3d0,"%255s",(Mat *)bottom_name);
                if (iVar7 != 1) {
                  pcVar16 = "parse blob_name failed";
                  goto LAB_001636de;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_388,bottom_name,&local_41d);
                std::__cxx11::string::operator=
                          ((string *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar19),
                           (string *)&local_388);
                std::__cxx11::string::~string((string *)&local_388);
                *(int *)((long)&pBVar2->producer + lVar19) = (int)local_410;
                (local_3c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar13] = (int)local_3e8 + (int)lVar13;
                lVar19 = lVar19 + 0x70;
              }
              iVar7 = ParamDict::load_param(&pd,local_3d0);
              pLVar9 = local_3f0;
              uVar11 = local_410;
              if (iVar7 == 0) {
                if (local_3f0->support_int8_storage == true) {
                  (this->opt).use_vulkan_compute = false;
                }
                local_388.cstep = 0;
                local_388.data = (void *)0x0;
                local_388.refcount._0_4_ = 0;
                local_388.refcount._4_4_ = 0;
                local_388.elemsize._0_4_ = 0;
                local_388._20_8_ = 0;
                local_388.h = 0;
                local_388.d = 0;
                local_388.c = 0;
                local_388.allocator = (Allocator *)0x0;
                local_388.dims = 0;
                local_388.w = 0;
                ParamDict::get((Mat *)bottom_name,&pd,0x1e,&local_388);
                piVar18 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if (local_388.allocator == (Allocator *)0x0) {
                      free(local_388.data);
                    }
                    else {
                      (*(local_388.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if ((bottom_name._0_8_ != 0) &&
                   ((long)(int)bottom_name._56_4_ * bottom_name._64_8_ != 0)) {
                  piVar18 = (int *)(bottom_name._0_8_ + 0xc);
                  for (lVar19 = 0; iVar7 = 1, lVar19 < top_count; lVar19 = lVar19 + 1) {
                    iVar8 = (local_3c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar19];
                    pBVar2 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar12 = piVar18[-3];
                    if (iVar12 == 3) {
                      uVar10 = piVar18[-2];
                      uVar11 = (ulong)(int)uVar10;
                      iVar7 = piVar18[-1];
                      lVar15 = (long)iVar7;
                      iVar17 = *piVar18;
                      sVar20 = lVar15 * uVar11 + 3 & 0x3ffffffffffffffc;
                      pMVar14 = &pBVar2[iVar8].shape;
                      piVar3 = pBVar2[iVar8].shape.refcount;
                      if (piVar3 == (int *)0x0) {
LAB_0016330e:
                        iVar12 = 3;
                      }
                      else {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 != 0) goto LAB_0016330e;
                        __ptr = pBVar2[iVar8].shape.data;
                        pAVar4 = pBVar2[iVar8].shape.allocator;
                        local_3f8 = uVar11;
                        local_3e0 = lVar15;
                        if (pAVar4 == (Allocator *)0x0) {
LAB_00163327:
                          local_414 = iVar17;
                          local_400 = &pBVar2[iVar8].shape;
                          free(__ptr);
                          uVar10 = (uint)local_3f8;
                          iVar7 = (int)local_3e0;
                          pMVar14 = local_400;
                          iVar17 = local_414;
                        }
                        else {
                          local_414 = iVar17;
                          local_400 = pMVar14;
                          (*pAVar4->_vptr_Allocator[3])();
                          iVar12 = 3;
                          uVar10 = (uint)local_3f8;
                          iVar7 = (int)local_3e0;
                          pMVar14 = local_400;
                          iVar17 = local_414;
                        }
                      }
LAB_00163346:
                      pMVar14->data = (void *)0x0;
                      pMVar14->refcount = (int *)0x0;
                      pBVar2[iVar8].shape.elemsize = 4;
                      pBVar2[iVar8].shape.elempack = 1;
                      pBVar2[iVar8].shape.allocator = (Allocator *)0x0;
                      pBVar2[iVar8].shape.dims = iVar12;
                      pBVar2[iVar8].shape.w = uVar10;
                      pBVar2[iVar8].shape.h = iVar7;
                      pBVar2[iVar8].shape.d = 1;
                      pBVar2[iVar8].shape.c = iVar17;
                      pBVar2[iVar8].shape.cstep = sVar20;
                      pLVar9 = local_3f0;
                    }
                    else {
                      if (iVar12 == 2) {
                        uVar10 = piVar18[-2];
                        uVar11 = (ulong)(int)uVar10;
                        iVar17 = piVar18[-1];
                        lVar15 = (long)iVar17;
                        sVar20 = lVar15 * uVar11;
                        piVar3 = pBVar2[iVar8].shape.refcount;
                        if (piVar3 != (int *)0x0) {
                          LOCK();
                          *piVar3 = *piVar3 + -1;
                          UNLOCK();
                          if (*piVar3 == 0) {
                            __ptr = pBVar2[iVar8].shape.data;
                            pAVar4 = pBVar2[iVar8].shape.allocator;
                            iVar17 = iVar7;
                            local_3f8 = uVar11;
                            local_3e0 = lVar15;
                            if (pAVar4 == (Allocator *)0x0) goto LAB_00163327;
                            local_400 = &pBVar2[iVar8].shape;
                            (*pAVar4->_vptr_Allocator[3])();
                            iVar12 = 2;
                            uVar10 = (uint)local_3f8;
                            iVar7 = (int)local_3e0;
                            pMVar14 = local_400;
                            iVar17 = 1;
                            goto LAB_00163346;
                          }
                        }
                        iVar7 = iVar17;
                        iVar17 = 2;
LAB_00163317:
                        iVar12 = iVar17;
                        pMVar14 = &pBVar2[iVar8].shape;
                        iVar17 = 1;
                        goto LAB_00163346;
                      }
                      if (iVar12 == 1) {
                        uVar10 = piVar18[-2];
                        sVar20 = (size_t)(int)uVar10;
                        piVar3 = pBVar2[iVar8].shape.refcount;
                        iVar17 = iVar7;
                        if (piVar3 != (int *)0x0) {
                          LOCK();
                          *piVar3 = *piVar3 + -1;
                          UNLOCK();
                          if (*piVar3 == 0) {
                            __ptr = pBVar2[iVar8].shape.data;
                            pAVar4 = pBVar2[iVar8].shape.allocator;
                            local_3f8 = (ulong)uVar10;
                            if (pAVar4 == (Allocator *)0x0) {
                              local_3e0 = 1;
                              goto LAB_00163327;
                            }
                            local_400 = &pBVar2[iVar8].shape;
                            (*pAVar4->_vptr_Allocator[3])();
                            iVar7 = 1;
                            uVar10 = (uint)local_3f8;
                            pMVar14 = local_400;
                            iVar12 = iVar7;
                            iVar17 = iVar7;
                            goto LAB_00163346;
                          }
                        }
                        goto LAB_00163317;
                      }
                    }
                    piVar18 = piVar18 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (&pLVar9->bottom_shapes,(long)bottom_count);
                lVar19 = 0;
                for (lVar15 = 0; lVar15 < bottom_count; lVar15 = lVar15 + 1) {
                  iVar7 = (local_3b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar15];
                  pBVar2 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar5 = (pLVar9->bottom_shapes).
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  puVar1 = (undefined8 *)((long)&pMVar5->data + lVar19);
                  if ((Mat *)puVar1 != &pBVar2[iVar7].shape) {
                    piVar18 = pBVar2[iVar7].shape.refcount;
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + 1;
                      UNLOCK();
                    }
                    piVar18 = *(int **)((long)&pMVar5->refcount + lVar19);
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + -1;
                      UNLOCK();
                      if (*piVar18 == 0) {
                        plVar6 = *(long **)((long)&pMVar5->allocator + lVar19);
                        if (plVar6 == (long *)0x0) {
                          free(*(void **)((long)&pMVar5->data + lVar19));
                        }
                        else {
                          (**(code **)(*plVar6 + 0x18))();
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar5->cstep + lVar19) = 0;
                    *(undefined8 *)((long)puVar1 + 0xc) = 0;
                    *(undefined8 *)((long)puVar1 + 0x14) = 0;
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    *(undefined4 *)((long)&pMVar5->c + lVar19) = 0;
                    puVar1 = (undefined8 *)((long)&pMVar5->dims + lVar19);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    piVar18 = pBVar2[iVar7].shape.refcount;
                    puVar1 = (undefined8 *)((long)&pMVar5->data + lVar19);
                    *puVar1 = pBVar2[iVar7].shape.data;
                    puVar1[1] = piVar18;
                    *(size_t *)((long)&pMVar5->elemsize + lVar19) = pBVar2[iVar7].shape.elemsize;
                    *(int *)((long)&pMVar5->elempack + lVar19) = pBVar2[iVar7].shape.elempack;
                    *(Allocator **)((long)&pMVar5->allocator + lVar19) =
                         pBVar2[iVar7].shape.allocator;
                    iVar8 = pBVar2[iVar7].shape.w;
                    iVar12 = pBVar2[iVar7].shape.h;
                    iVar17 = pBVar2[iVar7].shape.d;
                    piVar18 = (int *)((long)&pMVar5->dims + lVar19);
                    *piVar18 = pBVar2[iVar7].shape.dims;
                    piVar18[1] = iVar8;
                    piVar18[2] = iVar12;
                    piVar18[3] = iVar17;
                    *(int *)((long)&pMVar5->c + lVar19) = pBVar2[iVar7].shape.c;
                    *(size_t *)((long)&pMVar5->cstep + lVar19) = pBVar2[iVar7].shape.cstep;
                  }
                  lVar19 = lVar19 + 0x48;
                  this = local_3a8;
                }
                this_01 = &local_3f0->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(this_01,(long)top_count);
                lVar19 = 0;
                for (lVar15 = 0; lVar15 < top_count; lVar15 = lVar15 + 1) {
                  iVar7 = (local_3c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar15];
                  pBVar2 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar5 = (this_01->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar1 = (undefined8 *)((long)&pMVar5->data + lVar19);
                  if ((Mat *)puVar1 != &pBVar2[iVar7].shape) {
                    piVar18 = pBVar2[iVar7].shape.refcount;
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + 1;
                      UNLOCK();
                    }
                    piVar18 = *(int **)((long)&pMVar5->refcount + lVar19);
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + -1;
                      UNLOCK();
                      if (*piVar18 == 0) {
                        plVar6 = *(long **)((long)&pMVar5->allocator + lVar19);
                        if (plVar6 == (long *)0x0) {
                          free(*(void **)((long)&pMVar5->data + lVar19));
                        }
                        else {
                          (**(code **)(*plVar6 + 0x18))();
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar5->cstep + lVar19) = 0;
                    *(undefined8 *)((long)puVar1 + 0xc) = 0;
                    *(undefined8 *)((long)puVar1 + 0x14) = 0;
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    *(undefined4 *)((long)&pMVar5->c + lVar19) = 0;
                    puVar1 = (undefined8 *)((long)&pMVar5->dims + lVar19);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    piVar18 = pBVar2[iVar7].shape.refcount;
                    puVar1 = (undefined8 *)((long)&pMVar5->data + lVar19);
                    *puVar1 = pBVar2[iVar7].shape.data;
                    puVar1[1] = piVar18;
                    *(size_t *)((long)&pMVar5->elemsize + lVar19) = pBVar2[iVar7].shape.elemsize;
                    *(int *)((long)&pMVar5->elempack + lVar19) = pBVar2[iVar7].shape.elempack;
                    *(Allocator **)((long)&pMVar5->allocator + lVar19) =
                         pBVar2[iVar7].shape.allocator;
                    iVar8 = pBVar2[iVar7].shape.w;
                    iVar12 = pBVar2[iVar7].shape.h;
                    iVar17 = pBVar2[iVar7].shape.d;
                    piVar18 = (int *)((long)&pMVar5->dims + lVar19);
                    *piVar18 = pBVar2[iVar7].shape.dims;
                    piVar18[1] = iVar8;
                    piVar18[2] = iVar12;
                    piVar18[3] = iVar17;
                    *(int *)((long)&pMVar5->c + lVar19) = pBVar2[iVar7].shape.c;
                    *(size_t *)((long)&pMVar5->cstep + lVar19) = pBVar2[iVar7].shape.cstep;
                  }
                  lVar19 = lVar19 + 0x48;
                  this = local_3a8;
                }
                iVar7 = (*local_3f0->_vptr_Layer[2])(local_3f0,&pd);
                dr = local_3d0;
                if (iVar7 == 0) {
                  (this->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_410] = local_3f0;
                  iVar7 = 0;
                }
                else {
                  fprintf(_stderr,"layer load_param %d %s failed",local_410,
                          (local_3b8->_M_dataplus)._M_p);
                  fputc(10,_stderr);
                  iVar7 = 0xe;
                }
                if (bottom_name._8_8_ != 0) {
                  LOCK();
                  *(int *)bottom_name._8_8_ = *(int *)bottom_name._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)bottom_name._8_8_ == 0) {
                    if (bottom_name._32_8_ == 0) {
                      free((void *)bottom_name._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)bottom_name._32_8_ + 0x18))();
                    }
                  }
                }
                uVar11 = local_410;
                if ((iVar7 != 0xe) && (iVar7 != 0)) goto LAB_001636f4;
              }
              else {
                fprintf(_stderr,"ParamDict load_param %d %s failed",local_410 & 0xffffffff,
                        (local_3b8->_M_dataplus)._M_p);
                fputc(10,_stderr);
              }
              local_3e8 = local_3e8 + lVar13;
              uVar11 = uVar11 + 1;
            } while( true );
          }
          pcVar16 = "invalid layer_count or blob_count";
          sStack_430 = 0x21;
        }
        else {
          pcVar16 = "parse blob_count failed";
          sStack_430 = 0x17;
        }
      }
      else {
        pcVar16 = "parse layer_count failed";
        sStack_430 = 0x18;
      }
    }
    else {
      pcVar16 = "param is too old, please regenerate";
      sStack_430 = 0x23;
    }
  }
  else {
    pcVar16 = "parse magic failed";
    sStack_430 = 0x12;
  }
  fwrite(pcVar16,sStack_430,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}